

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

Address __thiscall Socket::getLocalAddress(Socket *this)

{
  int iVar1;
  SocketError *this_00;
  allocator local_49;
  string local_48 [36];
  socklen_t local_24;
  Socket *pSStack_20;
  socklen_t localAddressLength;
  Socket *this_local;
  Address address;
  
  local_24 = 0x10;
  pSStack_20 = this;
  iVar1 = getsockname(this->socketDescriptor,(sockaddr *)&this_local,&local_24);
  if (iVar1 == -1) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Socket error: could not get address of assigned socket!",&local_49);
    SocketError::SocketError(this_00,(string *)local_48,0);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  return _this_local;
}

Assistant:

Address Socket::getLocalAddress(){
    Address address;
    socklen_t localAddressLength = sizeof(address);
    if (getsockname(socketDescriptor,(struct sockaddr *) &address, &localAddressLength) == -1) {
        throw SocketError("Socket error: could not get address of assigned socket!");
    }
    else{
        return address;
    }
}